

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIOHelpers.hpp
# Opt level: O2

void TasGrid::IO::readVector<TasGrid::IO::mode_ascii_type,double>
               (istream *is,vector<double,_std::allocator<double>_> *x)

{
  pointer pdVar1;
  double *i;
  pointer pdVar2;
  
  pdVar1 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pdVar2 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    ::std::istream::_M_extract<double>((double *)is);
  }
  return;
}

Assistant:

void readVector(std::istream &is, std::vector<VecType> &x){
    if (std::is_same<iomode, mode_ascii_type>::value){
        for(auto &i : x) is >> i;
    }else{
        is.read((char*) x.data(), x.size() * sizeof(VecType));
    }
}